

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::set_allocated_stringclasslabels
          (TextClassifier *this,StringVector *stringclasslabels)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_ClassLabels(this);
  if (stringclasslabels != (StringVector *)0x0) {
    uVar1 = (stringclasslabels->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      stringclasslabels =
           (StringVector *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&stringclasslabels->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 200;
    (this->ClassLabels_).stringclasslabels_ = stringclasslabels;
  }
  return;
}

Assistant:

void TextClassifier::set_allocated_stringclasslabels(::CoreML::Specification::StringVector* stringclasslabels) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_ClassLabels();
  if (stringclasslabels) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(stringclasslabels));
    if (message_arena != submessage_arena) {
      stringclasslabels = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, stringclasslabels, submessage_arena);
    }
    set_has_stringclasslabels();
    ClassLabels_.stringclasslabels_ = stringclasslabels;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CoreMLModels.TextClassifier.stringClassLabels)
}